

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_sink.c
# Opt level: O0

int sink_phidep(jit_State *J,IRRef ref,int *workp)

{
  int iVar1;
  IRIns *pIVar2;
  IRIns *ir;
  int *workp_local;
  IRRef ref_local;
  jit_State *J_local;
  
  pIVar2 = (J->cur).ir + ref;
  if (*workp == 0) {
    J_local._4_4_ = 1;
  }
  else {
    *workp = *workp + -1;
    if (((pIVar2->field_1).t.irt & 0x40) == 0) {
      if ((0x8000 < (pIVar2->field_0).op1) &&
         (iVar1 = sink_phidep(J,(uint)(pIVar2->field_0).op1,workp), iVar1 != 0)) {
        return 1;
      }
      if ((0x8000 < (pIVar2->field_0).op2) &&
         (iVar1 = sink_phidep(J,(uint)(pIVar2->field_0).op2,workp), iVar1 != 0)) {
        return 1;
      }
      J_local._4_4_ = 0;
    }
    else {
      J_local._4_4_ = 1;
    }
  }
  return J_local._4_4_;
}

Assistant:

static int sink_phidep(jit_State *J, IRRef ref, int *workp)
{
  IRIns *ir = IR(ref);
  if (!*workp) return 1;  /* Give up and pretend it does. */
  (*workp)--;
  if (irt_isphi(ir->t)) return 1;
  if (ir->op1 >= REF_FIRST && sink_phidep(J, ir->op1, workp)) return 1;
  if (ir->op2 >= REF_FIRST && sink_phidep(J, ir->op2, workp)) return 1;
  return 0;
}